

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O2

void Wlc_WinCompute_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vLeaves,Vec_Int_t *vNodes)

{
  ushort uVar1;
  int Id;
  Wlc_Obj_t *pObj_00;
  Vec_Int_t *p_00;
  int i;
  
  uVar1 = *(ushort *)pObj;
  if ((char)uVar1 < '\0') {
    return;
  }
  *(ushort *)pObj = uVar1 | 0x80;
  p_00 = vLeaves;
  if (((uVar1 & 0x3f) < 0x33) && ((0x43800030080c0U >> (uVar1 & 0x3f) & 1) != 0)) {
    for (i = 0; p_00 = vNodes, i < (int)pObj->nFanins; i = i + 1) {
      Id = Wlc_ObjFaninId(pObj,i);
      pObj_00 = Wlc_NtkObj(p,Id);
      Wlc_WinCompute_rec(p,pObj_00,vLeaves,vNodes);
    }
  }
  Vec_IntPush(p_00,(int)(((long)pObj - (long)p->pObjs) / 0x18));
  return;
}

Assistant:

void Wlc_WinCompute_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Int_t * vNodes )
{
    Wlc_Obj_t * pFanin;  int i;
    if ( pObj->Mark )
        return;
    pObj->Mark = 1;
    if ( !Wlc_ObjIsArithm(pObj) )
    {
        Vec_IntPush( vLeaves, Wlc_ObjId(p, pObj) );
        return;
    }
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        Wlc_WinCompute_rec( p, pFanin, vLeaves, vNodes );
    Vec_IntPush( vNodes, Wlc_ObjId(p, pObj) );
}